

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::moveMemoryRegWithCharOffsetToReg
               (CodeGen *codeGen,Registers dest,Registers srcMemReg,char offset)

{
  undefined3 in_register_00000011;
  uchar *__args;
  uchar local_29 [2];
  Registers local_27;
  uchar local_26 [3];
  Registers local_23;
  uchar local_22 [2];
  
  if (CONCAT31(in_register_00000011,srcMemReg) == 4) {
    local_26[1] = 0x48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_29 + 4);
    local_26[0] = 0x8b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_29 + 3);
    local_27 = dest << 3 | 0x44;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_29 + 2);
    local_29[1] = 0x24;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_29 + 1);
    __args = local_29;
  }
  else {
    local_22[1] = 0x48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_22 + 1);
    local_22[0] = 0x8b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_22);
    local_23 = dest << 3 | srcMemReg | 0x40;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,&local_23);
    __args = local_29 + 5;
  }
  *__args = offset;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,__args);
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithCharOffsetToReg(CodeGen& codeGen, Registers dest, Registers srcMemReg, char offset) {
		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0x48);
			codeGen.push_back(0x8b);
			codeGen.push_back(0x40 | (Byte)srcMemReg | ((Byte)dest << 3));
			codeGen.push_back(offset);
		} else {
			codeGen.push_back(0x48);
			codeGen.push_back(0x8B);
			codeGen.push_back(0x44 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
			codeGen.push_back(offset);
		}
	}